

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span-main.t.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  vector<lest::test,_std::allocator<lest::test>_> local_28;
  
  specification();
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_28,&specification::tests);
  lest::make<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char_const*>
            (&local_40,(lest *)(argv + 1),argv + argc,in_RCX);
  iVar1 = lest::run(&local_28,&local_40,(ostream *)&std::cout);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_28);
  return iVar1;
}

Assistant:

int main( int argc, char * argv[] )
{
    return lest::run( specification(), argc, argv );
}